

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::check_spot_timeseries_args_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  char *option;
  long lVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  Options *opts_00;
  long lVar6;
  ConfigManager tmpmgr;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  _anonymous_namespace_ *local_48;
  ConfigManager local_40;
  
  local_48 = this;
  bVar2 = cali::ConfigManager::Options::is_enabled((Options *)this,"timeseries");
  if (bVar2) {
    cali::ConfigManager::ConfigManager(&local_40);
    cali::ConfigManager::add_config_spec(&local_40,(ConfigInfo *)spot_timeseries_info);
    get_timeseries_config_string_abi_cxx11_(&local_70,local_48,opts_00);
    cali::ConfigManager::check_abi_cxx11_
              (__return_storage_ptr__,&local_40,local_70._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    cali::ConfigManager::~ConfigManager(&local_40);
  }
  else {
    local_50 = &__return_storage_ptr__->field_2;
    bVar2 = false;
    lVar6 = 0;
    do {
      option = *(char **)((long)&PTR_anon_var_dwarf_59427c_0027c380 + lVar6);
      bVar3 = cali::ConfigManager::Options::is_set((Options *)local_48,option);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,option,(allocator<char> *)&local_40);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          lVar1 = plVar4[3];
          local_50->_M_allocated_capacity = *psVar5;
          *(long *)((long)local_50 + 8) = lVar1;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (!bVar2) {
            return __return_storage_ptr__;
          }
          break;
        }
      }
      lVar6 = lVar6 + 8;
      bVar2 = lVar6 == 0x28;
    } while (!bVar2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string check_spot_timeseries_args(const cali::ConfigManager::Options& opts)
{
    if (opts.is_enabled("timeseries")) {
        // Check if the timeseries options are valid

        cali::ConfigManager tmpmgr;

        tmpmgr.add_config_spec(spot_timeseries_info);
        return tmpmgr.check(get_timeseries_config_string(opts).c_str());
    } else {
        // Warn when a timeseries option is set but timeseries is disabled

        const char* tsopts[] = { "timeseries.maxrows",
                                 "timeseries.iteration_interval",
                                 "timeseries.time_interval",
                                 "timeseries.target_loops",
                                 "timeseries.metrics" };

        for (const char* opt : tsopts)
            if (opts.is_set(opt))
                return std::string(opt) + " is set but the timeseries option is not enabled";
    }

    return "";
}